

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURL_conflict * curl_easy_duphandle(Curl_easy *data)

{
  curl_mimepart *part;
  CURLcode CVar1;
  CURLcode CVar2;
  Curl_easy *easy;
  char *pcVar3;
  size_t length;
  CookieInfo *pCVar4;
  curl_slist *pcVar5;
  long lVar6;
  
  easy = (Curl_easy *)(*Curl_ccalloc)(1,0x1760);
  if (easy == (Curl_easy *)0x0) {
    return (CURL_conflict *)0x0;
  }
  lVar6 = (data->set).buffer_size;
  (easy->set).buffer_size = lVar6;
  pcVar3 = (char *)(*Curl_cmalloc)(lVar6 + 1);
  (easy->state).buffer = pcVar3;
  if (pcVar3 == (char *)0x0) goto LAB_004380a6;
  pcVar3 = (char *)(*Curl_cmalloc)(0x100);
  (easy->state).headerbuff = pcVar3;
  if (pcVar3 == (char *)0x0) goto LAB_004380a6;
  (easy->state).headersize = 0x100;
  memcpy(&easy->set,&data->set,0x908);
  part = &(easy->set).mimepost;
  Curl_mime_initpart(part,easy);
  memset((easy->set).str,0,0x1f0);
  lVar6 = 0xc78;
  CVar2 = CURLE_OUT_OF_MEMORY;
  do {
    CVar1 = Curl_setstropt((char **)((long)easy->sockets + lVar6 + -0x80),
                           *(char **)((long)data->sockets + lVar6 + -0x80));
    if (CVar1 != CURLE_OK) goto LAB_0043809e;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0xe58);
  lVar6 = (data->set).postfieldsize;
  if ((lVar6 == 0) || (pcVar3 = (data->set).str[0x3d], pcVar3 == (char *)0x0)) {
LAB_00438075:
    CVar2 = Curl_mime_duppart(part,&(data->set).mimepost);
    if ((data->set).resolve != (curl_slist *)0x0) {
      (easy->change).resolve = (easy->set).resolve;
    }
  }
  else {
    length = curlx_sotouz(lVar6);
    pcVar3 = (char *)Curl_memdup(pcVar3,length);
    (easy->set).str[0x3d] = pcVar3;
    if (pcVar3 != (char *)0x0) {
      (easy->set).postfields = pcVar3;
      goto LAB_00438075;
    }
  }
LAB_0043809e:
  if (CVar2 == CURLE_OK) {
    (easy->state).conn_cache = (conncache *)0x0;
    (easy->state).lastconnect = (connectdata *)0x0;
    (easy->progress).flags = (data->progress).flags;
    (easy->progress).callback = (data->progress).callback;
    if (data->cookies != (CookieInfo *)0x0) {
      pCVar4 = Curl_cookie_init(data,data->cookies->filename,easy->cookies,(data->set).cookiesession
                               );
      easy->cookies = pCVar4;
      if (pCVar4 == (CookieInfo *)0x0) goto LAB_004380a6;
    }
    pcVar5 = (data->change).cookielist;
    if (pcVar5 != (curl_slist *)0x0) {
      pcVar5 = Curl_slist_duplicate(pcVar5);
      (easy->change).cookielist = pcVar5;
      if (pcVar5 == (curl_slist *)0x0) goto LAB_004380a6;
    }
    pcVar3 = (data->change).url;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(pcVar3);
      (easy->change).url = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_004380a6;
      (easy->change).url_alloc = true;
    }
    pcVar3 = (data->change).referer;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(pcVar3);
      (easy->change).referer = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_004380a6;
      (easy->change).referer_alloc = true;
    }
    pcVar3 = (easy->set).str[0x2b];
    if ((pcVar3 == (char *)0x0) || (CVar2 = Curl_ssl_set_engine(easy,pcVar3), CVar2 == CURLE_OK)) {
      Curl_initinfo(easy);
      easy->magic = 0xc0dedbad;
      return easy;
    }
  }
LAB_004380a6:
  curl_slist_free_all((easy->change).cookielist);
  (easy->change).cookielist = (curl_slist *)0x0;
  (*Curl_cfree)((easy->state).buffer);
  (easy->state).buffer = (char *)0x0;
  (*Curl_cfree)((easy->state).headerbuff);
  (easy->state).headerbuff = (char *)0x0;
  (*Curl_cfree)((easy->change).url);
  (easy->change).url = (char *)0x0;
  (*Curl_cfree)((easy->change).referer);
  (easy->change).referer = (char *)0x0;
  Curl_freeset(easy);
  (*Curl_cfree)(easy);
  return (CURL_conflict *)0x0;
}

Assistant:

struct Curl_easy *curl_easy_duphandle(struct Curl_easy *data)
{
  struct Curl_easy *outcurl = calloc(1, sizeof(struct Curl_easy));
  if(NULL == outcurl)
    goto fail;

  /*
   * We setup a few buffers we need. We should probably make them
   * get setup on-demand in the code, as that would probably decrease
   * the likeliness of us forgetting to init a buffer here in the future.
   */
  outcurl->set.buffer_size = data->set.buffer_size;
  outcurl->state.buffer = malloc(outcurl->set.buffer_size + 1);
  if(!outcurl->state.buffer)
    goto fail;

  outcurl->state.headerbuff = malloc(HEADERSIZE);
  if(!outcurl->state.headerbuff)
    goto fail;
  outcurl->state.headersize = HEADERSIZE;

  /* copy all userdefined values */
  if(dupset(outcurl, data))
    goto fail;

  /* the connection cache is setup on demand */
  outcurl->state.conn_cache = NULL;

  outcurl->state.lastconnect = NULL;

  outcurl->progress.flags    = data->progress.flags;
  outcurl->progress.callback = data->progress.callback;

  if(data->cookies) {
    /* If cookies are enabled in the parent handle, we enable them
       in the clone as well! */
    outcurl->cookies = Curl_cookie_init(data,
                                        data->cookies->filename,
                                        outcurl->cookies,
                                        data->set.cookiesession);
    if(!outcurl->cookies)
      goto fail;
  }

  /* duplicate all values in 'change' */
  if(data->change.cookielist) {
    outcurl->change.cookielist =
      Curl_slist_duplicate(data->change.cookielist);
    if(!outcurl->change.cookielist)
      goto fail;
  }

  if(data->change.url) {
    outcurl->change.url = strdup(data->change.url);
    if(!outcurl->change.url)
      goto fail;
    outcurl->change.url_alloc = TRUE;
  }

  if(data->change.referer) {
    outcurl->change.referer = strdup(data->change.referer);
    if(!outcurl->change.referer)
      goto fail;
    outcurl->change.referer_alloc = TRUE;
  }

  /* Reinitialize an SSL engine for the new handle
   * note: the engine name has already been copied by dupset */
  if(outcurl->set.str[STRING_SSL_ENGINE]) {
    if(Curl_ssl_set_engine(outcurl, outcurl->set.str[STRING_SSL_ENGINE]))
      goto fail;
  }

  /* Clone the resolver handle, if present, for the new handle */
  if(Curl_resolver_duphandle(&outcurl->state.resolver,
                             data->state.resolver))
    goto fail;

  Curl_convert_setup(outcurl);

  Curl_initinfo(outcurl);

  outcurl->magic = CURLEASY_MAGIC_NUMBER;

  /* we reach this point and thus we are OK */

  return outcurl;

  fail:

  if(outcurl) {
    curl_slist_free_all(outcurl->change.cookielist);
    outcurl->change.cookielist = NULL;
    Curl_safefree(outcurl->state.buffer);
    Curl_safefree(outcurl->state.headerbuff);
    Curl_safefree(outcurl->change.url);
    Curl_safefree(outcurl->change.referer);
    Curl_freeset(outcurl);
    free(outcurl);
  }

  return NULL;
}